

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sswSim.c
# Opt level: O2

int Ssw_SmlCountEqual(Ssw_Sml_t *p,Aig_Obj_t *pObjLi,Aig_Obj_t *pObjLo)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  long lVar6;
  
  if ((pObjLo->field_0x18 & 8) == 0) {
    iVar1 = p->nWordsTotal;
    iVar2 = pObjLi->Id;
    iVar3 = pObjLo->Id;
    iVar5 = 0;
    for (lVar6 = (long)p->nWordsPref; lVar6 < iVar1; lVar6 = lVar6 + 1) {
      iVar4 = Aig_WordCountOnes(~(*(uint *)((long)&p[1].pAig + lVar6 * 4 + (long)(iVar2 * iVar1) * 4
                                           ) ^
                                 *(uint *)((long)&p[1].pAig + lVar6 * 4 + (long)(iVar3 * iVar1) * 4)
                                 ));
      iVar5 = iVar5 + iVar4;
    }
    return iVar5;
  }
  __assert_fail("pObjLo->fPhase == 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/ssw/sswSim.c"
                ,0x112,"int Ssw_SmlCountEqual(Ssw_Sml_t *, Aig_Obj_t *, Aig_Obj_t *)");
}

Assistant:

int Ssw_SmlCountEqual( Ssw_Sml_t * p, Aig_Obj_t * pObjLi, Aig_Obj_t * pObjLo )
{
    unsigned * pSimLi, * pSimLo;
    int k, Counter = 0;
    assert( pObjLo->fPhase == 0 );
    // pObjLi->fPhase may be 1, but the LI simulation data is not complemented!
    pSimLi   = Ssw_ObjSim( p, pObjLi->Id );
    pSimLo   = Ssw_ObjSim( p, pObjLo->Id );
    for ( k = p->nWordsPref; k < p->nWordsTotal; k++ )
        Counter += Aig_WordCountOnes( ~(pSimLi[k] ^ pSimLo[k]) );
    return Counter;
}